

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gostsum.c
# Opt level: O1

int hash_file(gost_hash_ctx *ctx,char *filename,char *sum,int mode)

{
  int fd;
  int iVar1;
  
  iVar1 = 0;
  fd = open(filename,mode);
  if (fd < 0) {
    perror(filename);
  }
  else {
    iVar1 = hash_stream(ctx,fd,sum);
    if (iVar1 == 0) {
      perror(filename);
      close(fd);
      iVar1 = 0;
    }
    else {
      close(fd);
      iVar1 = 1;
    }
  }
  return iVar1;
}

Assistant:

int hash_file(gost_hash_ctx * ctx, char *filename, char *sum, int mode)
{
    int fd;
    if ((fd = open(filename, mode)) < 0) {
        perror(filename);
        return 0;
    }
    if (!hash_stream(ctx, fd, sum)) {
        perror(filename);
        close(fd);
        return 0;
    }
    close(fd);
    return 1;
}